

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerGLSL::constant_op_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRConstantOp *cop)

{
  __node_base_ptr *cast_op1_00;
  uint uVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  SPIRType *type_00;
  ulong uVar6;
  TypedID *this_00;
  TypedID<(spirv_cross::Types)3> *pTVar7;
  mapped_type *initializers;
  CompilerError *pCVar8;
  uint *puVar9;
  SPIRType *pSVar10;
  size_t sVar11;
  char (*in_R9) [2];
  undefined8 in_stack_fffffffffffff558;
  undefined4 uVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_4;
  char (*in_stack_fffffffffffff568) [2];
  char (*in_stack_fffffffffffff578) [2];
  string local_938;
  string local_918;
  string local_8f8;
  undefined1 local_8d8 [8];
  SPIRType expected;
  SPIRType *arg_type;
  string local_760;
  undefined1 local_739;
  undefined1 local_738 [8];
  SPIRType expected_type;
  string cast_op1;
  string cast_op0;
  BaseType local_5a0;
  uint32_t uStack_59c;
  bool skip_cast_if_equal_type;
  BaseType input_type;
  uint32_t bit_width;
  undefined1 local_590 [8];
  SPIRConstant tmp_const;
  TypedID<(spirv_cross::Types)3> local_420;
  TypeID local_41c;
  uint32_t local_418;
  ConstantID local_414;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> local_410;
  TypeID local_3d4;
  ConstantID local_3d0;
  TypedID<(spirv_cross::Types)3> local_3cc;
  uint32_t local_3c8;
  uint32_t local_3c4;
  uint32_t old_const;
  uint32_t new_const;
  uint32_t target_type_id;
  uint32_t target_id;
  uint32_t idx;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> new_init;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  string local_2f0;
  TypedID<(spirv_cross::Types)0> local_2cc;
  undefined1 local_2c8 [8];
  SPIRConstant c;
  uint32_t index;
  uint32_t i;
  string right_arg;
  string left_arg;
  uint32_t left_components;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  uint32_t local_88;
  uint32_t local_84;
  uint32_t op1;
  uint32_t op0;
  undefined1 local_50 [8];
  string op;
  bool unary;
  bool binary;
  SPIRType *type;
  SPIRConstantOp *cop_local;
  CompilerGLSL *this_local;
  string *expr;
  
  uVar12 = (undefined4)((ulong)in_stack_fffffffffffff558 >> 0x20);
  uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&cop->basetype);
  type_00 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar3);
  op.field_2._M_local_buf[0xf] = '\0';
  op.field_2._M_local_buf[0xe] = '\0';
  ::std::__cxx11::string::string((string *)local_50);
  bVar2 = is_legacy(this);
  if ((bVar2) && (bVar2 = is_unsigned_opcode(*(Op *)&(cop->super_IVariant).field_0xc), bVar2)) {
    pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(pCVar8,"Unsigned integers are not supported on legacy targets.");
    __cxa_throw(pCVar8,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  switch(*(undefined4 *)&(cop->super_IVariant).field_0xc) {
  case 0x4f:
    type_to_glsl_constructor_abi_cxx11_(__return_storage_ptr__,this,type_00);
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"(");
    puVar9 = VectorView<unsigned_int>::operator[]
                       (&(cop->arguments).super_VectorView<unsigned_int>,0);
    pSVar10 = Compiler::expression_type(&this->super_Compiler,*puVar9);
    uVar1 = pSVar10->vecsize;
    puVar9 = VectorView<unsigned_int>::operator[]
                       (&(cop->arguments).super_VectorView<unsigned_int>,0);
    to_enclosed_expression_abi_cxx11_((string *)((long)&right_arg.field_2 + 8),this,*puVar9,true);
    puVar9 = VectorView<unsigned_int>::operator[]
                       (&(cop->arguments).super_VectorView<unsigned_int>,1);
    to_enclosed_expression_abi_cxx11_((string *)&index,this,*puVar9,true);
    for (c.specialization_constant_macro_name.field_2._12_4_ = 2;
        uVar12 = c.specialization_constant_macro_name.field_2._12_4_,
        sVar11 = VectorView<unsigned_int>::size(&(cop->arguments).super_VectorView<unsigned_int>),
        (uint)uVar12 < (uint)sVar11;
        c.specialization_constant_macro_name.field_2._12_4_ =
             c.specialization_constant_macro_name.field_2._12_4_ + 1) {
      puVar9 = VectorView<unsigned_int>::operator[]
                         (&(cop->arguments).super_VectorView<unsigned_int>,
                          (ulong)(uint)c.specialization_constant_macro_name.field_2._12_4_);
      c.specialization_constant_macro_name.field_2._8_4_ = *puVar9;
      if (c.specialization_constant_macro_name.field_2._8_4_ == 0xffffffff) {
        SPIRConstant::SPIRConstant((SPIRConstant *)local_2c8);
        c.super_IVariant._vptr_IVariant._4_4_ = (type_00->parent_type).id;
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&type_00->parent_type);
        TypedID<(spirv_cross::Types)0>::TypedID(&local_2cc,0);
        uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_2cc);
        if (uVar3 == uVar4) {
          __assert_fail("type.parent_type != ID(0)",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_glsl.cpp"
                        ,0x1665,
                        "virtual string spirv_cross::CompilerGLSL::constant_op_expression(const SPIRConstantOp &)"
                       );
        }
        constant_expression_abi_cxx11_(&local_2f0,this,(SPIRConstant *)local_2c8,false,false);
        ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_2f0);
        ::std::__cxx11::string::~string((string *)&local_2f0);
        SPIRConstant::~SPIRConstant((SPIRConstant *)local_2c8);
      }
      else if ((uint)c.specialization_constant_macro_name.field_2._8_4_ < uVar1) {
        ::std::operator+(&local_370,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&right_arg.field_2 + 8),".");
        ::std::operator+(&local_350,&local_370,
                         "xyzw"[(uint)c.specialization_constant_macro_name.field_2._8_4_]);
        ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_350);
        ::std::__cxx11::string::~string((string *)&local_350);
        ::std::__cxx11::string::~string((string *)&local_370);
      }
      else {
        ::std::operator+(&local_330,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&index
                         ,".");
        ::std::operator+(&local_310,&local_330,
                         "xyzw"[c.specialization_constant_macro_name.field_2._8_4_ - uVar1]);
        ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_310);
        ::std::__cxx11::string::~string((string *)&local_310);
        ::std::__cxx11::string::~string((string *)&local_330);
      }
      uVar5 = c.specialization_constant_macro_name.field_2._12_4_ + 1;
      sVar11 = VectorView<unsigned_int>::size(&(cop->arguments).super_VectorView<unsigned_int>);
      if (uVar5 < (uint)sVar11) {
        ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
      }
    }
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,")");
    ::std::__cxx11::string::~string((string *)&index);
    ::std::__cxx11::string::~string((string *)(right_arg.field_2._M_local_buf + 8));
    goto LAB_005395a5;
  default:
    pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(pCVar8,"Unimplemented spec constant op.");
    __cxa_throw(pCVar8,&CompilerError::typeinfo,CompilerError::~CompilerError);
  case 0x51:
    new_init.stack_storage.aligned_char[0x1f] = '\0';
    puVar9 = VectorView<unsigned_int>::operator[]
                       (&(cop->arguments).super_VectorView<unsigned_int>,0);
    uVar3 = *puVar9;
    puVar9 = VectorView<unsigned_int>::operator[]
                       (&(cop->arguments).super_VectorView<unsigned_int>,1);
    sVar11 = VectorView<unsigned_int>::size(&(cop->arguments).super_VectorView<unsigned_int>);
    access_chain_internal_abi_cxx11_
              (__return_storage_ptr__,this,uVar3,puVar9,(int)sVar11 - 1,1,(AccessChainMeta *)0x0);
    new_init.stack_storage.aligned_char[0x1f] = '\x01';
    goto LAB_005395a5;
  case 0x52:
    puVar9 = VectorView<unsigned_int>::operator[]
                       (&(cop->arguments).super_VectorView<unsigned_int>,1);
    TypedID<(spirv_cross::Types)3>::TypedID((TypedID<(spirv_cross::Types)3> *)&target_id,*puVar9);
    get_composite_constant_ids
              ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> *)&idx,this,
               (ConstantID)target_id);
    new_const = TypedID::operator_cast_to_unsigned_int((TypedID *)&(cop->super_IVariant).self);
    old_const = TypedID::operator_cast_to_unsigned_int((TypedID *)&cop->basetype);
    for (target_type_id = 2; uVar6 = (ulong)target_type_id,
        sVar11 = VectorView<unsigned_int>::size(&(cop->arguments).super_VectorView<unsigned_int>),
        uVar6 < sVar11 - 1; target_type_id = target_type_id + 1) {
      local_3c4 = ParsedIR::increase_bound_by(&(this->super_Compiler).ir,1);
      puVar9 = VectorView<unsigned_int>::operator[]
                         (&(cop->arguments).super_VectorView<unsigned_int>,(ulong)target_type_id);
      this_00 = (TypedID *)
                VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>::operator[]
                          ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_> *)&idx,
                           (ulong)*puVar9);
      local_3c8 = TypedID::operator_cast_to_unsigned_int(this_00);
      TypedID<(spirv_cross::Types)3>::TypedID(&local_3cc,local_3c4);
      puVar9 = VectorView<unsigned_int>::operator[]
                         (&(cop->arguments).super_VectorView<unsigned_int>,(ulong)target_type_id);
      pTVar7 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>::operator[]
                         ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_> *)&idx,
                          (ulong)*puVar9);
      pTVar7->id = local_3cc.id;
      TypedID<(spirv_cross::Types)3>::TypedID(&local_3d0,new_const);
      TypedID<(spirv_cross::Types)1>::TypedID(&local_3d4,old_const);
      set_composite_constant
                (this,local_3d0,local_3d4,
                 (SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> *)&idx);
      TypedID<(spirv_cross::Types)3>::TypedID(&local_414,local_3c8);
      get_composite_constant_ids(&local_410,this,local_414);
      SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>::operator=
                ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> *)&idx,&local_410);
      SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>::~SmallVector(&local_410);
      new_const = local_3c4;
      TypedID<(spirv_cross::Types)1>::TypedID(&local_41c,old_const);
      puVar9 = VectorView<unsigned_int>::operator[]
                         (&(cop->arguments).super_VectorView<unsigned_int>,(ulong)target_type_id);
      local_418 = (uint32_t)get_composite_member_type(this,local_41c,*puVar9);
      old_const = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_418);
    }
    puVar9 = VectorView<unsigned_int>::operator[]
                       (&(cop->arguments).super_VectorView<unsigned_int>,0);
    TypedID<(spirv_cross::Types)3>::TypedID(&local_420,*puVar9);
    puVar9 = VectorView<unsigned_int>::operator[]
                       (&(cop->arguments).super_VectorView<unsigned_int>,(ulong)target_type_id);
    pTVar7 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>::operator[]
                       ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_> *)&idx,
                        (ulong)*puVar9);
    pTVar7->id = local_420.id;
    TypedID<(spirv_cross::Types)3>::TypedID
              ((TypedID<(spirv_cross::Types)3> *)
               ((long)&tmp_const.specialization_constant_macro_name.field_2 + 0xc),new_const);
    TypedID<(spirv_cross::Types)1>::TypedID
              ((TypedID<(spirv_cross::Types)1> *)
               ((long)&tmp_const.specialization_constant_macro_name.field_2 + 8),old_const);
    set_composite_constant
              (this,(ConstantID)tmp_const.specialization_constant_macro_name.field_2._12_4_,
               (TypeID)tmp_const.specialization_constant_macro_name.field_2._8_4_,
               (SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> *)&idx);
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&cop->basetype);
    SPIRConstant::SPIRConstant((SPIRConstant *)local_590,uVar3);
    bit_width = (cop->basetype).id;
    input_type = TypedID::operator_cast_to_unsigned_int((TypedID *)&(cop->super_IVariant).self);
    initializers = ::std::
                   unordered_map<unsigned_int,_spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>_>_>_>
                   ::operator[](&this->const_composite_insert_ids,&input_type);
    fill_composite_constant(this,(SPIRConstant *)local_590,(TypeID)bit_width,initializers);
    constant_expression_abi_cxx11_
              (__return_storage_ptr__,this,(SPIRConstant *)local_590,false,false);
    SPIRConstant::~SPIRConstant((SPIRConstant *)local_590);
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>::~SmallVector
              ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> *)&idx);
    goto LAB_005395a5;
  case 0x71:
  case 0x72:
  case 0x73:
    type_to_glsl_constructor_abi_cxx11_((string *)&op1,this,type_00);
    ::std::__cxx11::string::operator=((string *)local_50,(string *)&op1);
    ::std::__cxx11::string::~string((string *)&op1);
    break;
  case 0x7e:
    op.field_2._M_local_buf[0xe] = '\x01';
    ::std::__cxx11::string::operator=((string *)local_50,"-");
    break;
  case 0x80:
    op.field_2._M_local_buf[0xf] = '\x01';
    ::std::__cxx11::string::operator=((string *)local_50,"+");
    break;
  case 0x82:
    op.field_2._M_local_buf[0xf] = '\x01';
    ::std::__cxx11::string::operator=((string *)local_50,"-");
    break;
  case 0x84:
    op.field_2._M_local_buf[0xf] = '\x01';
    ::std::__cxx11::string::operator=((string *)local_50,"*");
    break;
  case 0x86:
    op.field_2._M_local_buf[0xf] = '\x01';
    ::std::__cxx11::string::operator=((string *)local_50,"/");
    break;
  case 0x87:
    op.field_2._M_local_buf[0xf] = '\x01';
    ::std::__cxx11::string::operator=((string *)local_50,"/");
    break;
  case 0x89:
    op.field_2._M_local_buf[0xf] = '\x01';
    ::std::__cxx11::string::operator=((string *)local_50,"%");
    break;
  case 0x8a:
    puVar9 = VectorView<unsigned_int>::operator[]
                       (&(cop->arguments).super_VectorView<unsigned_int>,0);
    local_84 = *puVar9;
    puVar9 = VectorView<unsigned_int>::operator[]
                       (&(cop->arguments).super_VectorView<unsigned_int>,1);
    local_88 = *puVar9;
    to_enclosed_expression_abi_cxx11_(&local_a8,this,local_84,true);
    to_enclosed_expression_abi_cxx11_(&local_c8,this,local_88,true);
    to_enclosed_expression_abi_cxx11_(&local_e8,this,local_84,true);
    to_enclosed_expression_abi_cxx11_(&local_108,this,local_88,true);
    join<std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[4],char_const(&)[2],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
              (__return_storage_ptr__,(spirv_cross *)&local_a8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x66396a,
               (char (*) [4])&local_c8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x672d14,
               (char (*) [4])0x676d60,(char (*) [2])&local_e8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x67382a,
               (char (*) [4])&local_108,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x682405,
               in_stack_fffffffffffff578);
    ::std::__cxx11::string::~string((string *)&local_108);
    ::std::__cxx11::string::~string((string *)&local_e8);
    ::std::__cxx11::string::~string((string *)&local_c8);
    ::std::__cxx11::string::~string((string *)&local_a8);
    goto LAB_005395a5;
  case 0x8b:
    op.field_2._M_local_buf[0xf] = '\x01';
    ::std::__cxx11::string::operator=((string *)local_50,"%");
    break;
  case 0xa4:
    op.field_2._M_local_buf[0xf] = '\x01';
    ::std::__cxx11::string::operator=((string *)local_50,"==");
    break;
  case 0xa5:
    op.field_2._M_local_buf[0xf] = '\x01';
    ::std::__cxx11::string::operator=((string *)local_50,"!=");
    break;
  case 0xa6:
    op.field_2._M_local_buf[0xf] = '\x01';
    ::std::__cxx11::string::operator=((string *)local_50,"||");
    break;
  case 0xa7:
    op.field_2._M_local_buf[0xf] = '\x01';
    ::std::__cxx11::string::operator=((string *)local_50,"&&");
    break;
  case 0xa8:
    op.field_2._M_local_buf[0xe] = '\x01';
    ::std::__cxx11::string::operator=((string *)local_50,"!");
    break;
  case 0xa9:
    sVar11 = VectorView<unsigned_int>::size(&(cop->arguments).super_VectorView<unsigned_int>);
    if (sVar11 < 3) {
      pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar8,"Not enough arguments to OpSpecConstantOp.");
      __cxa_throw(pCVar8,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    puVar9 = VectorView<unsigned_int>::operator[]
                       (&(cop->arguments).super_VectorView<unsigned_int>,2);
    uVar3 = *puVar9;
    puVar9 = VectorView<unsigned_int>::operator[]
                       (&(cop->arguments).super_VectorView<unsigned_int>,1);
    uVar4 = *puVar9;
    puVar9 = VectorView<unsigned_int>::operator[]
                       (&(cop->arguments).super_VectorView<unsigned_int>,0);
    in_R9 = (char (*) [2])(ulong)*puVar9;
    bVar2 = to_trivial_mix_op(this,type_00,(string *)local_50,uVar3,uVar4,*puVar9);
    if (!bVar2) {
      puVar9 = VectorView<unsigned_int>::operator[]
                         (&(cop->arguments).super_VectorView<unsigned_int>,0);
      uVar3 = *puVar9;
      puVar9 = VectorView<unsigned_int>::operator[]
                         (&(cop->arguments).super_VectorView<unsigned_int>,1);
      uVar4 = *puVar9;
      puVar9 = VectorView<unsigned_int>::operator[]
                         (&(cop->arguments).super_VectorView<unsigned_int>,2);
      to_ternary_expression_abi_cxx11_(__return_storage_ptr__,this,type_00,uVar3,uVar4,*puVar9);
      goto LAB_005395a5;
    }
    break;
  case 0xaa:
    op.field_2._M_local_buf[0xf] = '\x01';
    ::std::__cxx11::string::operator=((string *)local_50,"==");
    break;
  case 0xab:
    op.field_2._M_local_buf[0xf] = '\x01';
    ::std::__cxx11::string::operator=((string *)local_50,"!=");
    break;
  case 0xac:
    op.field_2._M_local_buf[0xf] = '\x01';
    ::std::__cxx11::string::operator=((string *)local_50,">");
    break;
  case 0xad:
    op.field_2._M_local_buf[0xf] = '\x01';
    ::std::__cxx11::string::operator=((string *)local_50,">");
    break;
  case 0xae:
    op.field_2._M_local_buf[0xf] = '\x01';
    ::std::__cxx11::string::operator=((string *)local_50,">=");
    break;
  case 0xaf:
    op.field_2._M_local_buf[0xf] = '\x01';
    ::std::__cxx11::string::operator=((string *)local_50,">=");
    break;
  case 0xb0:
    op.field_2._M_local_buf[0xf] = '\x01';
    ::std::__cxx11::string::operator=((string *)local_50,"<");
    break;
  case 0xb1:
    op.field_2._M_local_buf[0xf] = '\x01';
    ::std::__cxx11::string::operator=((string *)local_50,"<");
    break;
  case 0xb2:
    op.field_2._M_local_buf[0xf] = '\x01';
    ::std::__cxx11::string::operator=((string *)local_50,"<=");
    break;
  case 0xb3:
    op.field_2._M_local_buf[0xf] = '\x01';
    ::std::__cxx11::string::operator=((string *)local_50,"<=");
    break;
  case 0xc2:
    op.field_2._M_local_buf[0xf] = '\x01';
    ::std::__cxx11::string::operator=((string *)local_50,">>");
    break;
  case 0xc3:
    op.field_2._M_local_buf[0xf] = '\x01';
    ::std::__cxx11::string::operator=((string *)local_50,">>");
    break;
  case 0xc4:
    op.field_2._M_local_buf[0xf] = '\x01';
    ::std::__cxx11::string::operator=((string *)local_50,"<<");
    break;
  case 0xc5:
    op.field_2._M_local_buf[0xf] = '\x01';
    ::std::__cxx11::string::operator=((string *)local_50,"|");
    break;
  case 0xc6:
    op.field_2._M_local_buf[0xf] = '\x01';
    ::std::__cxx11::string::operator=((string *)local_50,"^");
    break;
  case 199:
    op.field_2._M_local_buf[0xf] = '\x01';
    ::std::__cxx11::string::operator=((string *)local_50,"&");
    break;
  case 200:
    op.field_2._M_local_buf[0xe] = '\x01';
    ::std::__cxx11::string::operator=((string *)local_50,"~");
  }
  uStack_59c = 0;
  if (((((op.field_2._M_local_buf[0xe] & 1U) != 0) || ((op.field_2._M_local_buf[0xf] & 1U) != 0)) ||
      (*(int *)&(cop->super_IVariant).field_0xc == 0x72)) ||
     (*(int *)&(cop->super_IVariant).field_0xc == 0x71)) {
    puVar9 = VectorView<unsigned_int>::operator[]
                       (&(cop->arguments).super_VectorView<unsigned_int>,0);
    pSVar10 = Compiler::expression_type(&this->super_Compiler,*puVar9);
    uStack_59c = pSVar10->width;
  }
  bVar2 = opcode_is_sign_invariant(*(Op *)&(cop->super_IVariant).field_0xc);
  switch(*(undefined4 *)&(cop->super_IVariant).field_0xc) {
  case 0x71:
  case 0x86:
  case 0x89:
  case 0xac:
  case 0xae:
  case 0xb0:
  case 0xb2:
  case 0xc2:
    local_5a0 = to_unsigned_basetype(uStack_59c);
    break;
  case 0x72:
  case 0x7e:
  case 0x87:
  case 0x8b:
  case 0xad:
  case 0xaf:
  case 0xb1:
  case 0xb3:
  case 0xc3:
    local_5a0 = to_signed_basetype(uStack_59c);
    break;
  default:
    local_5a0 = type_00->basetype;
    break;
  case 0xaa:
  case 0xab:
    local_5a0 = to_signed_basetype(uStack_59c);
  }
  if ((op.field_2._M_local_buf[0xf] & 1U) == 0) {
    if ((op.field_2._M_local_buf[0xe] & 1U) == 0) {
      if ((*(int *)&(cop->super_IVariant).field_0xc == 0x72) ||
         (*(int *)&(cop->super_IVariant).field_0xc == 0x71)) {
        sVar11 = VectorView<unsigned_int>::size(&(cop->arguments).super_VectorView<unsigned_int>);
        if (sVar11 == 0) {
          pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(pCVar8,"Not enough arguments to OpSpecConstantOp.");
          __cxa_throw(pCVar8,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        puVar9 = VectorView<unsigned_int>::operator[]
                           (&(cop->arguments).super_VectorView<unsigned_int>,0);
        expected.member_name_cache._M_h._M_single_bucket =
             (__node_base_ptr)Compiler::expression_type(&this->super_Compiler,*puVar9);
        if ((((SPIRType *)expected.member_name_cache._M_h._M_single_bucket)->width < type_00->width)
           && (local_5a0 != ((SPIRType *)expected.member_name_cache._M_h._M_single_bucket)->basetype
              )) {
          SPIRType::SPIRType((SPIRType *)local_8d8,
                             (SPIRType *)expected.member_name_cache._M_h._M_single_bucket);
          expected.super_IVariant.self.id = local_5a0;
          puVar9 = VectorView<unsigned_int>::operator[]
                             (&(cop->arguments).super_VectorView<unsigned_int>,0);
          bitcast_glsl_abi_cxx11_(&local_8f8,this,(SPIRType *)local_8d8,*puVar9);
          join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                    (__return_storage_ptr__,(spirv_cross *)local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x676d60,
                     (char (*) [2])&local_8f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x682405,
                     in_R9);
          ::std::__cxx11::string::~string((string *)&local_8f8);
          SPIRType::~SPIRType((SPIRType *)local_8d8);
        }
        else {
          puVar9 = VectorView<unsigned_int>::operator[]
                             (&(cop->arguments).super_VectorView<unsigned_int>,0);
          to_expression_abi_cxx11_(&local_918,this,*puVar9,true);
          join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                    (__return_storage_ptr__,(spirv_cross *)local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x676d60,
                     (char (*) [2])&local_918,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x682405,
                     in_R9);
          ::std::__cxx11::string::~string((string *)&local_918);
        }
      }
      else {
        sVar11 = VectorView<unsigned_int>::size(&(cop->arguments).super_VectorView<unsigned_int>);
        if (sVar11 == 0) {
          pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(pCVar8,"Not enough arguments to OpSpecConstantOp.");
          __cxa_throw(pCVar8,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        puVar9 = VectorView<unsigned_int>::operator[]
                           (&(cop->arguments).super_VectorView<unsigned_int>,0);
        to_expression_abi_cxx11_(&local_938,this,*puVar9,true);
        join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                  (__return_storage_ptr__,(spirv_cross *)local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x676d60,
                   (char (*) [2])&local_938,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x682405,
                   in_R9);
        ::std::__cxx11::string::~string((string *)&local_938);
      }
    }
    else {
      sVar11 = VectorView<unsigned_int>::size(&(cop->arguments).super_VectorView<unsigned_int>);
      if (sVar11 == 0) {
        pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar8,"Not enough arguments to OpSpecConstantOp.");
        __cxa_throw(pCVar8,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      puVar9 = VectorView<unsigned_int>::operator[]
                         (&(cop->arguments).super_VectorView<unsigned_int>,0);
      bitcast_glsl_abi_cxx11_((string *)&arg_type,this,type_00,*puVar9);
      join<char_const(&)[2],std::__cxx11::string&,std::__cxx11::string,char_const(&)[2]>
                (__return_storage_ptr__,(spirv_cross *)0x676d60,(char (*) [2])local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arg_type,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x682405,in_R9
                );
      ::std::__cxx11::string::~string((string *)&arg_type);
    }
  }
  else {
    sVar11 = VectorView<unsigned_int>::size(&(cop->arguments).super_VectorView<unsigned_int>);
    if (sVar11 < 2) {
      pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar8,"Not enough arguments to OpSpecConstantOp.");
      __cxa_throw(pCVar8,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    ::std::__cxx11::string::string((string *)(cast_op1.field_2._M_local_buf + 8));
    cast_op1_00 = &expected_type.member_name_cache._M_h._M_single_bucket;
    ::std::__cxx11::string::string((string *)cast_op1_00);
    puVar9 = VectorView<unsigned_int>::operator[]
                       (&(cop->arguments).super_VectorView<unsigned_int>,0);
    uVar3 = *puVar9;
    puVar9 = VectorView<unsigned_int>::operator[]
                       (&(cop->arguments).super_VectorView<unsigned_int>,1);
    ts_4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           CONCAT44(uVar12,*puVar9);
    binary_op_bitcast_helper
              ((SPIRType *)local_738,this,(string *)(cast_op1.field_2._M_local_buf + 8),
               (string *)cast_op1_00,&local_5a0,uVar3,*puVar9,bVar2);
    if ((type_00->basetype == local_5a0) || (type_00->basetype == Boolean)) {
      join<char_const(&)[2],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                (__return_storage_ptr__,(spirv_cross *)0x676d60,
                 (char (*) [2])((long)&cast_op1.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x645fd9,
                 (char (*) [2])local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x645fd9,
                 (char (*) [2])&expected_type.member_name_cache._M_h._M_single_bucket,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x682405,
                 in_stack_fffffffffffff568);
    }
    else {
      expected_type.super_IVariant.self.id = local_5a0;
      local_739 = 0;
      (*(this->super_Compiler)._vptr_Compiler[0x3b])(__return_storage_ptr__,this,type_00,local_738);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'(');
      join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                (&local_760,(spirv_cross *)(cast_op1.field_2._M_local_buf + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x645fd9,
                 (char (*) [2])local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x645fd9,
                 (char (*) [2])&expected_type.member_name_cache._M_h._M_single_bucket,ts_4);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_760);
      ::std::__cxx11::string::~string((string *)&local_760);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,')');
      local_739 = 1;
    }
    SPIRType::~SPIRType((SPIRType *)local_738);
    ::std::__cxx11::string::~string
              ((string *)&expected_type.member_name_cache._M_h._M_single_bucket);
    ::std::__cxx11::string::~string((string *)(cast_op1.field_2._M_local_buf + 8));
  }
LAB_005395a5:
  ::std::__cxx11::string::~string((string *)local_50);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::constant_op_expression(const SPIRConstantOp &cop)
{
	auto &type = get<SPIRType>(cop.basetype);
	bool binary = false;
	bool unary = false;
	string op;

	if (is_legacy() && is_unsigned_opcode(cop.opcode))
		SPIRV_CROSS_THROW("Unsigned integers are not supported on legacy targets.");

	// TODO: Find a clean way to reuse emit_instruction.
	switch (cop.opcode)
	{
	case OpSConvert:
	case OpUConvert:
	case OpFConvert:
		op = type_to_glsl_constructor(type);
		break;

#define GLSL_BOP(opname, x) \
	case Op##opname:        \
		binary = true;      \
		op = x;             \
		break

#define GLSL_UOP(opname, x) \
	case Op##opname:        \
		unary = true;       \
		op = x;             \
		break

		GLSL_UOP(SNegate, "-");
		GLSL_UOP(Not, "~");
		GLSL_BOP(IAdd, "+");
		GLSL_BOP(ISub, "-");
		GLSL_BOP(IMul, "*");
		GLSL_BOP(SDiv, "/");
		GLSL_BOP(UDiv, "/");
		GLSL_BOP(UMod, "%");
		GLSL_BOP(SMod, "%");
		GLSL_BOP(ShiftRightLogical, ">>");
		GLSL_BOP(ShiftRightArithmetic, ">>");
		GLSL_BOP(ShiftLeftLogical, "<<");
		GLSL_BOP(BitwiseOr, "|");
		GLSL_BOP(BitwiseXor, "^");
		GLSL_BOP(BitwiseAnd, "&");
		GLSL_BOP(LogicalOr, "||");
		GLSL_BOP(LogicalAnd, "&&");
		GLSL_UOP(LogicalNot, "!");
		GLSL_BOP(LogicalEqual, "==");
		GLSL_BOP(LogicalNotEqual, "!=");
		GLSL_BOP(IEqual, "==");
		GLSL_BOP(INotEqual, "!=");
		GLSL_BOP(ULessThan, "<");
		GLSL_BOP(SLessThan, "<");
		GLSL_BOP(ULessThanEqual, "<=");
		GLSL_BOP(SLessThanEqual, "<=");
		GLSL_BOP(UGreaterThan, ">");
		GLSL_BOP(SGreaterThan, ">");
		GLSL_BOP(UGreaterThanEqual, ">=");
		GLSL_BOP(SGreaterThanEqual, ">=");

	case OpSRem:
	{
		uint32_t op0 = cop.arguments[0];
		uint32_t op1 = cop.arguments[1];
		return join(to_enclosed_expression(op0), " - ", to_enclosed_expression(op1), " * ", "(",
		                 to_enclosed_expression(op0), " / ", to_enclosed_expression(op1), ")");
	}

	case OpSelect:
	{
		if (cop.arguments.size() < 3)
			SPIRV_CROSS_THROW("Not enough arguments to OpSpecConstantOp.");

		// This one is pretty annoying. It's triggered from
		// uint(bool), int(bool) from spec constants.
		// In order to preserve its compile-time constness in Vulkan GLSL,
		// we need to reduce the OpSelect expression back to this simplified model.
		// If we cannot, fail.
		if (to_trivial_mix_op(type, op, cop.arguments[2], cop.arguments[1], cop.arguments[0]))
		{
			// Implement as a simple cast down below.
		}
		else
		{
			// Implement a ternary and pray the compiler understands it :)
			return to_ternary_expression(type, cop.arguments[0], cop.arguments[1], cop.arguments[2]);
		}
		break;
	}

	case OpVectorShuffle:
	{
		string expr = type_to_glsl_constructor(type);
		expr += "(";

		uint32_t left_components = expression_type(cop.arguments[0]).vecsize;
		string left_arg = to_enclosed_expression(cop.arguments[0]);
		string right_arg = to_enclosed_expression(cop.arguments[1]);

		for (uint32_t i = 2; i < uint32_t(cop.arguments.size()); i++)
		{
			uint32_t index = cop.arguments[i];
			if (index == 0xFFFFFFFF)
			{
				SPIRConstant c;
				c.constant_type = type.parent_type;
				assert(type.parent_type != ID(0));
				expr += constant_expression(c);
			}
			else if (index >= left_components)
			{
				expr += right_arg + "." + "xyzw"[index - left_components];
			}
			else
			{
				expr += left_arg + "." + "xyzw"[index];
			}

			if (i + 1 < uint32_t(cop.arguments.size()))
				expr += ", ";
		}

		expr += ")";
		return expr;
	}

	case OpCompositeExtract:
	{
		auto expr = access_chain_internal(cop.arguments[0], &cop.arguments[1], uint32_t(cop.arguments.size() - 1),
		                                  ACCESS_CHAIN_INDEX_IS_LITERAL_BIT, nullptr);
		return expr;
	}

	case OpCompositeInsert:
	{
		SmallVector<ConstantID> new_init = get_composite_constant_ids(cop.arguments[1]);
		uint32_t idx;
		uint32_t target_id = cop.self;
		uint32_t target_type_id = cop.basetype;
		// We have to drill down to the part we want to modify, and create new
		// constants for each containing part.
		for (idx = 2; idx < cop.arguments.size() - 1; ++idx)
		{
			uint32_t new_const = ir.increase_bound_by(1);
			uint32_t old_const = new_init[cop.arguments[idx]];
			new_init[cop.arguments[idx]] = new_const;
			set_composite_constant(target_id, target_type_id, new_init);
			new_init = get_composite_constant_ids(old_const);
			target_id = new_const;
			target_type_id = get_composite_member_type(target_type_id, cop.arguments[idx]);
		}
		// Now replace the initializer with the one from this instruction.
		new_init[cop.arguments[idx]] = cop.arguments[0];
		set_composite_constant(target_id, target_type_id, new_init);
		SPIRConstant tmp_const(cop.basetype);
		fill_composite_constant(tmp_const, cop.basetype, const_composite_insert_ids[cop.self]);
		return constant_expression(tmp_const);
	}

	default:
		// Some opcodes are unimplemented here, these are currently not possible to test from glslang.
		SPIRV_CROSS_THROW("Unimplemented spec constant op.");
	}

	uint32_t bit_width = 0;
	if (unary || binary || cop.opcode == OpSConvert || cop.opcode == OpUConvert)
		bit_width = expression_type(cop.arguments[0]).width;

	SPIRType::BaseType input_type;
	bool skip_cast_if_equal_type = opcode_is_sign_invariant(cop.opcode);

	switch (cop.opcode)
	{
	case OpIEqual:
	case OpINotEqual:
		input_type = to_signed_basetype(bit_width);
		break;

	case OpSLessThan:
	case OpSLessThanEqual:
	case OpSGreaterThan:
	case OpSGreaterThanEqual:
	case OpSMod:
	case OpSDiv:
	case OpShiftRightArithmetic:
	case OpSConvert:
	case OpSNegate:
		input_type = to_signed_basetype(bit_width);
		break;

	case OpULessThan:
	case OpULessThanEqual:
	case OpUGreaterThan:
	case OpUGreaterThanEqual:
	case OpUMod:
	case OpUDiv:
	case OpShiftRightLogical:
	case OpUConvert:
		input_type = to_unsigned_basetype(bit_width);
		break;

	default:
		input_type = type.basetype;
		break;
	}

#undef GLSL_BOP
#undef GLSL_UOP
	if (binary)
	{
		if (cop.arguments.size() < 2)
			SPIRV_CROSS_THROW("Not enough arguments to OpSpecConstantOp.");

		string cast_op0;
		string cast_op1;
		auto expected_type = binary_op_bitcast_helper(cast_op0, cast_op1, input_type, cop.arguments[0],
		                                              cop.arguments[1], skip_cast_if_equal_type);

		if (type.basetype != input_type && type.basetype != SPIRType::Boolean)
		{
			expected_type.basetype = input_type;
			auto expr = bitcast_glsl_op(type, expected_type);
			expr += '(';
			expr += join(cast_op0, " ", op, " ", cast_op1);
			expr += ')';
			return expr;
		}
		else
			return join("(", cast_op0, " ", op, " ", cast_op1, ")");
	}
	else if (unary)
	{
		if (cop.arguments.size() < 1)
			SPIRV_CROSS_THROW("Not enough arguments to OpSpecConstantOp.");

		// Auto-bitcast to result type as needed.
		// Works around various casting scenarios in glslang as there is no OpBitcast for specialization constants.
		return join("(", op, bitcast_glsl(type, cop.arguments[0]), ")");
	}
	else if (cop.opcode == OpSConvert || cop.opcode == OpUConvert)
	{
		if (cop.arguments.size() < 1)
			SPIRV_CROSS_THROW("Not enough arguments to OpSpecConstantOp.");

		auto &arg_type = expression_type(cop.arguments[0]);
		if (arg_type.width < type.width && input_type != arg_type.basetype)
		{
			auto expected = arg_type;
			expected.basetype = input_type;
			return join(op, "(", bitcast_glsl(expected, cop.arguments[0]), ")");
		}
		else
			return join(op, "(", to_expression(cop.arguments[0]), ")");
	}
	else
	{
		if (cop.arguments.size() < 1)
			SPIRV_CROSS_THROW("Not enough arguments to OpSpecConstantOp.");
		return join(op, "(", to_expression(cop.arguments[0]), ")");
	}
}